

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_mdef_gen.c
# Opt level: O3

int32 find_threshold(hashelement_t **triphonehash)

{
  int iVar1;
  int iVar2;
  int iVar3;
  cmd_ln_t *pcVar4;
  ulong uVar5;
  long lVar6;
  void *ptr;
  void *ptr_00;
  long lVar7;
  int *piVar8;
  hashelement_t *phVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  int iVar13;
  ulong uVar14;
  
  pcVar4 = cmd_ln_get();
  uVar5 = cmd_ln_int_r(pcVar4,"-minocc");
  pcVar4 = cmd_ln_get();
  lVar6 = cmd_ln_int_r(pcVar4,"-maxtriphones");
  uVar10 = (uint)uVar5;
  iVar2 = uVar10 + 1;
  if ((int)uVar10 < 10000) {
    iVar2 = 10000;
  }
  ptr = __ckd_calloc__((long)(iVar2 + 1),4,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                       ,0x267);
  ptr_00 = __ckd_calloc__((long)(iVar2 + 1),4,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                          ,0x268);
  lVar7 = 0;
  uVar11 = 0;
  uVar14 = 0;
  iVar3 = 0;
  do {
    for (phVar9 = triphonehash[lVar7]; phVar9 != (hashelement_t *)0x0; phVar9 = phVar9->next) {
      iVar1 = phVar9->count;
      lVar12 = (long)iVar1;
      if (0 < lVar12) {
        if ((int)uVar10 <= iVar1) {
          iVar3 = iVar3 + 1;
          iVar13 = iVar1;
          if (iVar2 <= iVar1) {
            iVar13 = iVar2;
          }
          lVar12 = (long)iVar13;
          piVar8 = (int *)((long)ptr_00 + lVar12 * 4);
          *piVar8 = *piVar8 + 1;
        }
        uVar14 = (ulong)(uint)((int)uVar14 + iVar1);
        piVar8 = (int *)((long)ptr + lVar12 * 4);
        *piVar8 = *piVar8 + 1;
        uVar11 = uVar11 + 1;
      }
    }
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0x5dc1);
  if ((int)lVar6 < iVar3) {
    piVar8 = (int *)((long)ptr_00 + (long)(int)uVar10 * 4);
    do {
      iVar3 = iVar3 - *piVar8;
      piVar8 = piVar8 + 1;
      uVar10 = (int)uVar5 + 1;
      uVar5 = (ulong)uVar10;
    } while ((int)lVar6 < iVar3);
  }
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
          ,0x280,"%d triphones extracted from transcripts\n",uVar14);
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
          ,0x281,"%d unique triphones extracted from transcripts\n",(ulong)uVar11);
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
          ,0x282,"%d triphones occur once in the transcripts\n",(ulong)*(uint *)((long)ptr + 4));
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
          ,0x283,"%d triphones occur twice in the transcripts\n",(ulong)*(uint *)((long)ptr + 8));
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
          ,0x284,"%d triphones occur thrice in the transcripts\n",(ulong)*(uint *)((long)ptr + 0xc))
  ;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
          ,0x285,"The rest of the triphones occur more than three times\n");
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
          ,0x286,"Count threshold is %d\n",(ulong)uVar10);
  ckd_free(ptr_00);
  ckd_free(ptr);
  return uVar10;
}

Assistant:

int32 find_threshold(hashelement_t  **triphonehash)
{
    hashelement_t *triphone_el;
    int32 tottph, ltottph, mincnt, maxtph, *countofcounts, *lcountofcounts;
    int32 i, cnt, unique, threshold, ceiling;

    mincnt = cmd_ln_int32("-minocc");
    maxtph = cmd_ln_int32("-maxtriphones");

    ceiling = mincnt < CEILING ? CEILING : mincnt+1;

    tottph = ltottph = unique = 0;
    countofcounts = (int32 *) ckd_calloc(ceiling+1,sizeof(int32));
    lcountofcounts = (int32 *) ckd_calloc(ceiling+1,sizeof(int32));
    for (i = 0; i < HASHSIZE; i++){
	triphone_el = triphonehash[i];
	while (triphone_el != NULL){
	    cnt = triphone_el->count;
	    if (cnt > 0) {
	        tottph += cnt;
	        if (cnt >= mincnt) {
	            ltottph ++;
		    if (cnt > ceiling) cnt = ceiling;
		    lcountofcounts[cnt]++;
	        }
	        countofcounts[cnt]++; unique++;
	    }
	    triphone_el = triphone_el->next;
	}
    }

    threshold = mincnt; 
    while (ltottph > maxtph) {
	ltottph -= lcountofcounts[threshold];
	threshold++;
    }

    E_INFO("%d triphones extracted from transcripts\n",tottph);
    E_INFO("%d unique triphones extracted from transcripts\n",unique);
    E_INFO("%d triphones occur once in the transcripts\n",countofcounts[1]);
    E_INFO("%d triphones occur twice in the transcripts\n",countofcounts[2]);
    E_INFO("%d triphones occur thrice in the transcripts\n",countofcounts[3]);
    E_INFO("The rest of the triphones occur more than three times\n");
    E_INFO("Count threshold is %d\n",threshold);

    ckd_free(lcountofcounts); ckd_free(countofcounts);
    return(threshold);
}